

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

int Saig_StrSimIsZero(Aig_Obj_t *pObj)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(int *)((long)(pObj->field_5).pData + lVar1 * 4) != 0) {
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return 1;
}

Assistant:

int Saig_StrSimIsZero( Aig_Obj_t * pObj )
{
    unsigned * pSims = (unsigned *)pObj->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims[i] != 0 )
            return 0;
    return 1;
}